

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O2

void Diligent::
     HashCombine<unsigned_int,unsigned_int,unsigned_int,float,unsigned_int,unsigned_int,float,float,float,float,float,float>
               (size_t *Seed,uint *FirstArg,uint *RestArgs,uint *RestArgs_1,float *RestArgs_2,
               uint *RestArgs_3,uint *RestArgs_4,float *RestArgs_5,float *RestArgs_6,
               float *RestArgs_7,float *RestArgs_8,float *RestArgs_9,float *RestArgs_10)

{
  HashCombine<unsigned_int>(Seed,FirstArg);
  HashCombine<unsigned_int,unsigned_int,float,unsigned_int,unsigned_int,float,float,float,float,float,float>
            (Seed,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7,RestArgs_8,RestArgs_9,RestArgs_10);
  return;
}

Assistant:

void HashCombine(std::size_t& Seed, const FirstArgType& FirstArg, const RestArgsType&... RestArgs) noexcept
{
    HashCombine(Seed, FirstArg);
    HashCombine(Seed, RestArgs...); // recursive call using pack expansion syntax
}